

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Line_SetTextureOffset
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  side_t *psVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  FLineIdIterator itr;
  
  iVar2 = 0;
  if ((uint)arg3 < 2 && arg0 != 0) {
    dVar4 = (double)arg1 * 1.52587890625e-05;
    dVar5 = (double)arg2 * 1.52587890625e-05;
    itr.start = tagManager.IDHashFirst[(ulong)(uint)arg0 & 0xff];
    itr.searchtag = arg0;
    while( true ) {
      uVar3 = FLineIdIterator::Next(&itr);
      if ((int)uVar3 < 0) break;
      psVar1 = lines[uVar3].sidedef[(uint)arg3];
      if (psVar1 != (side_t *)0x0) {
        if ((arg4 & 8U) == 0) {
          if (arg1 != 0x7fff0000) {
            if ((arg4 & 1U) != 0) {
              psVar1->textures[0].xOffset = dVar4;
            }
            if ((arg4 & 2U) != 0) {
              psVar1->textures[1].xOffset = dVar4;
            }
            if ((arg4 & 4U) != 0) {
              psVar1->textures[2].xOffset = dVar4;
            }
          }
          if (arg2 != 0x7fff0000) {
            if ((arg4 & 1U) != 0) {
              psVar1->textures[0].yOffset = dVar5;
            }
            if ((arg4 & 2U) != 0) {
              psVar1->textures[1].yOffset = dVar5;
            }
            if ((arg4 & 4U) != 0) {
              psVar1->textures[2].yOffset = dVar5;
            }
          }
        }
        else {
          if (arg1 != 0x7fff0000) {
            if ((arg4 & 1U) != 0) {
              psVar1->textures[0].xOffset = psVar1->textures[0].xOffset + dVar4;
            }
            if ((arg4 & 2U) != 0) {
              psVar1->textures[1].xOffset = psVar1->textures[1].xOffset + dVar4;
            }
            if ((arg4 & 4U) != 0) {
              psVar1->textures[2].xOffset = psVar1->textures[2].xOffset + dVar4;
            }
          }
          if (arg2 != 0x7fff0000) {
            if ((arg4 & 1U) != 0) {
              psVar1->textures[0].yOffset = psVar1->textures[0].yOffset + dVar5;
            }
            if ((arg4 & 2U) != 0) {
              psVar1->textures[1].yOffset = psVar1->textures[1].yOffset + dVar5;
            }
            if ((arg4 & 4U) != 0) {
              psVar1->textures[2].yOffset = psVar1->textures[2].yOffset + dVar5;
            }
          }
        }
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

FUNC(LS_Line_SetTextureOffset)
// Line_SetTextureOffset (id, x, y, side, flags)
{
	const int NO_CHANGE = 32767 << 16;
	double farg1 = arg1 / 65536.;
	double farg2 = arg2 / 65536.;

	if (arg0 == 0 || arg3 < 0 || arg3 > 1)
		return false;

	FLineIdIterator itr(arg0);
	int line;
	while ((line = itr.Next()) >= 0)
	{
		side_t *side = lines[line].sidedef[arg3];
		if (side != NULL)
		{

			if ((arg4&8)==0)
			{
				// set
				if (arg1 != NO_CHANGE)
				{
					if (arg4&1) side->SetTextureXOffset(side_t::top, farg1);
					if (arg4&2) side->SetTextureXOffset(side_t::mid, farg1);
					if (arg4&4) side->SetTextureXOffset(side_t::bottom, farg1);
				}
				if (arg2 != NO_CHANGE)
				{
					if (arg4&1) side->SetTextureYOffset(side_t::top, farg2);
					if (arg4&2) side->SetTextureYOffset(side_t::mid, farg2);
					if (arg4&4) side->SetTextureYOffset(side_t::bottom, farg2);
				}
			}
			else
			{
				// add
				if (arg1 != NO_CHANGE)
				{
					if (arg4&1) side->AddTextureXOffset(side_t::top, farg1);
					if (arg4&2) side->AddTextureXOffset(side_t::mid, farg1);
					if (arg4&4) side->AddTextureXOffset(side_t::bottom, farg1);
				}
				if (arg2 != NO_CHANGE)
				{
					if (arg4&1) side->AddTextureYOffset(side_t::top, farg2);
					if (arg4&2) side->AddTextureYOffset(side_t::mid, farg2);
					if (arg4&4) side->AddTextureYOffset(side_t::bottom, farg2);
				}
			}
		}
	}
	return true;
}